

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall
MutableS2ShapeIndex::InteriorTracker::TestEdge(InteriorTracker *this,int32 shape_id,Edge *edge)

{
  bool bVar1;
  Edge *edge_local;
  int32 shape_id_local;
  InteriorTracker *this_local;
  
  bVar1 = S2EdgeCrosser::EdgeOrVertexCrossing(&this->crosser_,&edge->v0,&edge->v1);
  if (bVar1) {
    ToggleShape(this,shape_id);
  }
  return;
}

Assistant:

inline void MutableS2ShapeIndex::InteriorTracker::TestEdge(
    int32 shape_id, const S2Shape::Edge& edge) {
  if (crosser_.EdgeOrVertexCrossing(&edge.v0, &edge.v1)) {
    ToggleShape(shape_id);
  }
}